

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# struct.pb.cc
# Opt level: O3

uint8_t * __thiscall
google::protobuf::Struct::_InternalSerialize
          (Struct *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  anon_union_32_1_898eb381_for_TypeDefinedMapFieldBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Value>_3
  *m;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key;
  unique_ptr<const_void_*[],_std::default_delete<const_void_*[]>_> uVar1;
  long lVar2;
  char *in_R9;
  uint uVar3;
  ulong uVar4;
  long *plVar5;
  string_view field_name;
  string_view field_name_00;
  MapSorterPtr<google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Value>_>
  local_40;
  
  protobuf::internal::MapFieldBase::SyncMapWithRepeatedField
            ((MapFieldBase *)&(this->field_0)._impl_);
  if (*(int *)((long)&this->field_0 + 0x10) != 0) {
    protobuf::internal::MapFieldBase::SyncMapWithRepeatedField
              ((MapFieldBase *)&(this->field_0)._impl_);
    if ((stream->is_serialization_deterministic_ == true) &&
       (m = &(this->field_0)._impl_.fields_.
             super_TypeDefinedMapFieldBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Value>
             .field_0,
       1 < (m->map_).
           super_KeyMapBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           .super_UntypedMapBase.num_elements_)) {
      protobuf::internal::
      MapSorterPtr<google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Value>_>
      ::MapSorterPtr(&local_40,&m->map_);
      uVar1._M_t.super___uniq_ptr_impl<const_void_*,_std::default_delete<const_void_*[]>_>._M_t.
      super__Tuple_impl<0UL,_const_void_**,_std::default_delete<const_void_*[]>_>.
      super__Head_base<0UL,_const_void_**,_false>._M_head_impl =
           (__uniq_ptr_data<const_void_*,_std::default_delete<const_void_*[]>,_true,_true>)
           (__uniq_ptr_data<const_void_*,_std::default_delete<const_void_*[]>,_true,_true>)
           local_40.items_;
      if (local_40.size_ != 0) {
        lVar2 = 0;
        do {
          key = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                 ((long)uVar1._M_t.
                        super___uniq_ptr_impl<const_void_*,_std::default_delete<const_void_*[]>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_const_void_**,_std::default_delete<const_void_*[]>_>.
                        super__Head_base<0UL,_const_void_**,_false>._M_head_impl + lVar2);
          target = protobuf::internal::
                   MapEntryFuncs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Value,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11>
                   ::InternalSerialize(1,key,(Value *)(key + 1),target,stream);
          field_name._M_str = in_R9;
          field_name._M_len = (size_t)"google.protobuf.Struct.fields";
          protobuf::internal::WireFormatLite::VerifyUtf8String
                    ((WireFormatLite *)(key->_M_dataplus)._M_p,
                     (char *)(ulong)(uint)key->_M_string_length,1,0x1d,field_name);
          lVar2 = lVar2 + 8;
        } while (local_40.size_ << 3 != lVar2);
      }
      if (local_40.items_._M_t.
          super___uniq_ptr_impl<const_void_*,_std::default_delete<const_void_*[]>_>._M_t.
          super__Tuple_impl<0UL,_const_void_**,_std::default_delete<const_void_*[]>_>.
          super__Head_base<0UL,_const_void_**,_false>._M_head_impl !=
          (__uniq_ptr_impl<const_void_*,_std::default_delete<const_void_*[]>_>)0x0) {
        operator_delete__((void *)local_40.items_._M_t.
                                  super___uniq_ptr_impl<const_void_*,_std::default_delete<const_void_*[]>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_const_void_**,_std::default_delete<const_void_*[]>_>
                                  .super__Head_base<0UL,_const_void_**,_false>._M_head_impl);
      }
    }
    else {
      uVar3 = *(uint *)((long)&this->field_0 + 0x18);
      uVar4 = (ulong)uVar3;
      if (uVar3 != *(uint *)((long)&this->field_0 + 0x14)) {
        plVar5 = *(long **)(*(long *)((long)&(this->field_0)._impl_.fields_.
                                             super_TypeDefinedMapFieldBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Value>
                                             .field_0 + 0x10) + uVar4 * 8);
        if (plVar5 == (long *)0x0) {
          protobuf::internal::protobuf_assumption_failed
                    ("node != nullptr",
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map.h"
                     ,0x22e);
        }
        do {
          do {
            target = protobuf::internal::
                     MapEntryFuncs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Value,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11>
                     ::InternalSerialize(1,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)(plVar5 + 1),(Value *)(plVar5 + 5),target,stream);
            field_name_00._M_str = in_R9;
            field_name_00._M_len = (size_t)"google.protobuf.Struct.fields";
            protobuf::internal::WireFormatLite::VerifyUtf8String
                      ((WireFormatLite *)plVar5[1],(char *)(ulong)*(uint *)(plVar5 + 2),1,0x1d,
                       field_name_00);
            plVar5 = (long *)*plVar5;
          } while (plVar5 != (long *)0x0);
          do {
            uVar3 = (int)uVar4 + 1;
            uVar4 = (ulong)uVar3;
            if (*(uint *)((long)&this->field_0 + 0x14) <= uVar3) goto LAB_00ebc755;
            plVar5 = *(long **)(*(long *)((long)&(this->field_0)._impl_.fields_.
                                                 super_TypeDefinedMapFieldBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Value>
                                                 .field_0 + 0x10) + (ulong)uVar3 * 8);
          } while (plVar5 == (long *)0x0);
        } while( true );
      }
    }
  }
LAB_00ebc755:
  uVar4 = (this->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if ((uVar4 & 1) != 0) {
    target = protobuf::internal::WireFormat::InternalSerializeUnknownFieldsToArray
                       ((UnknownFieldSet *)((uVar4 & 0xfffffffffffffffe) + 8),target,stream);
  }
  return target;
}

Assistant:

::uint8_t* PROTOBUF_NONNULL Struct::_InternalSerialize(
    ::uint8_t* PROTOBUF_NONNULL target,
    ::google::protobuf::io::EpsCopyOutputStream* PROTOBUF_NONNULL stream) const {
  const Struct& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(serialize_to_array_start:google.protobuf.Struct)
  ::uint32_t cached_has_bits = 0;
  (void)cached_has_bits;

  // map<string, .google.protobuf.Value> fields = 1;
  if (!this_._internal_fields().empty()) {
    using MapType = ::google::protobuf::Map<std::string, ::google::protobuf::Value>;
    using WireHelper = _pbi::MapEntryFuncs<std::string, ::google::protobuf::Value,
                                   _pbi::WireFormatLite::TYPE_STRING,
                                   _pbi::WireFormatLite::TYPE_MESSAGE>;
    const auto& field = this_._internal_fields();

    if (stream->IsSerializationDeterministic() && field.size() > 1) {
      for (const auto& entry : ::google::protobuf::internal::MapSorterPtr<MapType>(field)) {
        target = WireHelper::InternalSerialize(
            1, entry.first, entry.second, target, stream);
        ::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
            entry.first.data(), static_cast<int>(entry.first.length()),
 ::google::protobuf::internal::WireFormatLite::SERIALIZE, "google.protobuf.Struct.fields");
      }
    } else {
      for (const auto& entry : field) {
        target = WireHelper::InternalSerialize(
            1, entry.first, entry.second, target, stream);
        ::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
            entry.first.data(), static_cast<int>(entry.first.length()),
 ::google::protobuf::internal::WireFormatLite::SERIALIZE, "google.protobuf.Struct.fields");
      }
    }
  }

  if (ABSL_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
    target =
        ::_pbi::WireFormat::InternalSerializeUnknownFieldsToArray(
            this_._internal_metadata_.unknown_fields<::google::protobuf::UnknownFieldSet>(::google::protobuf::UnknownFieldSet::default_instance), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:google.protobuf.Struct)
  return target;
}